

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O2

void __thiscall
fizplex::ColMatrix_MatrixMultiplicationWithZero_Test::TestBody
          (ColMatrix_MatrixMultiplicationWithZero_Test *this)

{
  char *message;
  AssertHelper AStack_98;
  AssertionResult gtest_ar;
  ColMatrix local_80;
  ColMatrix zero;
  ColMatrix idnt;
  
  ColMatrix::ColMatrix(&zero,3,3);
  ColMatrix::identity(&idnt,3);
  ColMatrix::operator*(&local_80,&idnt,&zero);
  testing::internal::CmpHelperEQ<fizplex::ColMatrix,fizplex::ColMatrix>
            ((internal *)&gtest_ar,"zero","idnt * zero",&zero,&local_80);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_80.cols);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x60,message);
    testing::internal::AssertHelper::operator=(&AStack_98,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&AStack_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&idnt.cols);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&zero.cols);
  return;
}

Assistant:

TEST(ColMatrix, MatrixMultiplicationWithZero) {
  const auto zero = ColMatrix(3, 3);
  const auto idnt = ColMatrix::identity(3);
  EXPECT_EQ(zero, idnt * zero);
}